

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a28a9::BNTest_ExpZeroModOne_Test::TestBody(BNTest_ExpZeroModOne_Test *this)

{
  UniquePtr<BIGNUM> UVar1;
  UniquePtr<BIGNUM> UVar2;
  UniquePtr<BIGNUM> a_00;
  int iVar3;
  BIGNUM *pBVar4;
  char *in_R9;
  char *pcVar5;
  AssertHelper local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  string local_70;
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> r;
  UniquePtr<BIGNUM> zero;
  UniquePtr<BIGNUM> minus_one;
  UniquePtr<BIGNUM> a;
  
  zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
  a._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
  r._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
  minus_one._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<bignum_st,_bssl::internal::Deleter,_true,_true>)BN_new();
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
       zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
      zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)&gtest_ar_,(AssertionResult *)0x48c0ff,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x63f,local_70._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
         a._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
        a._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_70,(internal *)&gtest_ar_,(AssertionResult *)(anon_var_dwarf_146c22 + 0xc),
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x640,local_70._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
           r._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
          r._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_70,(internal *)&gtest_ar_,(AssertionResult *)0x50ca89,"false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x641,local_70._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
             minus_one._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)
            minus_one._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_70,(internal *)&gtest_ar_,(AssertionResult *)0x4c1889,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x642,local_70._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          iVar3 = BN_set_word((BIGNUM *)
                              minus_one._M_t.
                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,1);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar3 != 0;
          if (iVar3 == 0) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_70,(internal *)&gtest_ar_,
                       (AssertionResult *)"BN_set_word(minus_one.get(), 1)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_80,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x643,local_70._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            BN_set_negative((BIGNUM *)
                            minus_one._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                            ._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,1);
            iVar3 = BN_rand((BIGNUM *)
                            a._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0x400,0,0);
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ = iVar3 != 0;
            if (iVar3 == 0) {
              testing::Message::Message((Message *)&local_78);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_70,(internal *)&gtest_ar_,
                         (AssertionResult *)"BN_rand(a.get(), 1024, 0, 0)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_80,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x645,local_70._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_.message_);
              BN_zero((BIGNUM *)
                      zero._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
              a_00 = a;
              UVar2 = zero;
              UVar1 = r;
              pBVar4 = BN_value_one();
              iVar3 = BN_mod_exp((BIGNUM *)
                                 UVar1._M_t.
                                 super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                 (BIGNUM *)
                                 a_00._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                 ._M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                 (BIGNUM *)
                                 UVar2._M_t.
                                 super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar4,
                                 (BN_CTX *)
                                 (this->super_BNTest).ctx_._M_t.
                                 super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
              gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar_.success_ = iVar3 != 0;
              if (iVar3 == 0) {
                testing::Message::Message((Message *)&local_78);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_70,(internal *)&gtest_ar_,
                           (AssertionResult *)
                           "BN_mod_exp(r.get(), a.get(), zero.get(), BN_value_one(), ctx())","false"
                           ,"true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_80,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x648,local_70._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                iVar3 = BN_is_zero((BIGNUM *)
                                   r._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                   _M_t.super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar3 != 0;
                if (!gtest_ar_.success_) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_70,(internal *)&gtest_ar_,
                             (AssertionResult *)"BN_is_zero(r.get())","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_80,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x649,local_70._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_80);
                  std::__cxx11::string::~string((string *)&local_70);
                  if (local_78._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_78._M_head_impl + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_.message_);
                UVar2 = zero;
                UVar1 = r;
                pBVar4 = BN_value_one();
                iVar3 = BN_mod_exp((BIGNUM *)
                                   UVar1._M_t.
                                   super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                   (BIGNUM *)
                                   UVar2._M_t.
                                   super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                   (BIGNUM *)
                                   UVar2._M_t.
                                   super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar4,
                                   (BN_CTX *)
                                   (this->super_BNTest).ctx_._M_t.
                                   super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl);
                gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                      )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )0x0;
                gtest_ar_.success_ = iVar3 != 0;
                if (iVar3 == 0) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_70,(internal *)&gtest_ar_,
                             (AssertionResult *)
                             "BN_mod_exp(r.get(), zero.get(), zero.get(), BN_value_one(), ctx())",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_80,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x64b,local_70._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  iVar3 = BN_is_zero((BIGNUM *)
                                     r._M_t.
                                     super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar3 != 0;
                  if (!gtest_ar_.success_) {
                    testing::Message::Message((Message *)&local_78);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_70,(internal *)&gtest_ar_,
                               (AssertionResult *)"BN_is_zero(r.get())","false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_80,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x64c,local_70._M_dataplus._M_p);
                    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                    testing::internal::AssertHelper::~AssertHelper(&local_80);
                    std::__cxx11::string::~string((string *)&local_70);
                    if (local_78._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_78._M_head_impl + 8))();
                    }
                  }
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar_.message_);
                  UVar2 = zero;
                  UVar1 = r;
                  pBVar4 = BN_value_one();
                  pcVar5 = (char *)0x0;
                  iVar3 = BN_mod_exp_mont_word
                                    ((BIGNUM *)
                                     UVar1._M_t.
                                     super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0x2a,
                                     (BIGNUM *)
                                     UVar2._M_t.
                                     super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar4,
                                     (BN_CTX *)
                                     (this->super_BNTest).ctx_._M_t.
                                     super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>._M_t
                                     .super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                                     (BN_MONT_CTX *)0x0);
                  gtest_ar_.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl =
                       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )0x0;
                  gtest_ar_.success_ = iVar3 != 0;
                  if (iVar3 == 0) {
                    testing::Message::Message((Message *)&local_78);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_70,(internal *)&gtest_ar_,
                               (AssertionResult *)
                               "BN_mod_exp_mont_word(r.get(), 42, zero.get(), BN_value_one(), ctx(), nullptr)"
                               ,"false","true",pcVar5);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_80,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x64f,local_70._M_dataplus._M_p);
                    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                  }
                  else {
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar_.message_);
                    iVar3 = BN_is_zero((BIGNUM *)
                                       r._M_t.
                                       super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                    gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )0x0;
                    gtest_ar_.success_ = iVar3 != 0;
                    if (!gtest_ar_.success_) {
                      testing::Message::Message((Message *)&local_78);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_70,(internal *)&gtest_ar_,
                                 (AssertionResult *)"BN_is_zero(r.get())","false","true",pcVar5);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_80,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                 ,0x650,local_70._M_dataplus._M_p);
                      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                      testing::internal::AssertHelper::~AssertHelper(&local_80);
                      std::__cxx11::string::~string((string *)&local_70);
                      if (local_78._M_head_impl !=
                          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *
                          )0x0) {
                        (**(code **)(*(long *)local_78._M_head_impl + 8))();
                      }
                    }
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar_.message_);
                    UVar2 = zero;
                    UVar1 = r;
                    pBVar4 = BN_value_one();
                    pcVar5 = (char *)0x0;
                    iVar3 = BN_mod_exp_mont_word
                                      ((BIGNUM *)
                                       UVar1._M_t.
                                       super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,0,
                                       (BIGNUM *)
                                       UVar2._M_t.
                                       super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                       _M_t.
                                       super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,pBVar4
                                       ,(BN_CTX *)
                                        (this->super_BNTest).ctx_._M_t.
                                        super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>.
                                        _M_t.
                                        super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                        .super__Head_base<0UL,_bignum_ctx_*,_false>._M_head_impl,
                                       (BN_MONT_CTX *)0x0);
                    gtest_ar_.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl =
                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )0x0;
                    gtest_ar_.success_ = iVar3 != 0;
                    if (iVar3 == 0) {
                      testing::Message::Message((Message *)&local_78);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                (&local_70,(internal *)&gtest_ar_,
                                 (AssertionResult *)
                                 "BN_mod_exp_mont_word(r.get(), 0, zero.get(), BN_value_one(), ctx(), nullptr)"
                                 ,"false","true",pcVar5);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_80,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                 ,0x652,local_70._M_dataplus._M_p);
                      testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                    }
                    else {
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                      iVar3 = BN_is_zero((BIGNUM *)
                                         r._M_t.
                                         super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                         .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      gtest_ar_.success_ = iVar3 != 0;
                      if (!gtest_ar_.success_) {
                        testing::Message::Message((Message *)&local_78);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&local_70,(internal *)&gtest_ar_,
                                   (AssertionResult *)"BN_is_zero(r.get())","false","true",pcVar5);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_80,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0x653,local_70._M_dataplus._M_p);
                        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                        testing::internal::AssertHelper::~AssertHelper(&local_80);
                        std::__cxx11::string::~string((string *)&local_70);
                        if (local_78._M_head_impl !=
                            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                             *)0x0) {
                          (**(code **)(*(long *)local_78._M_head_impl + 8))();
                        }
                      }
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar_.message_);
                      UVar2 = zero;
                      UVar1 = r;
                      pBVar4 = BN_value_one();
                      pcVar5 = (char *)0x0;
                      iVar3 = BN_mod_exp_mont((BIGNUM *)
                                              UVar1._M_t.
                                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_st_*,_false>.
                                              _M_head_impl,
                                              (BIGNUM *)
                                              UVar2._M_t.
                                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_st_*,_false>.
                                              _M_head_impl,
                                              (BIGNUM *)
                                              UVar2._M_t.
                                              super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_st_*,_false>.
                                              _M_head_impl,pBVar4,
                                              (BN_CTX *)
                                              (this->super_BNTest).ctx_._M_t.
                                              super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                              .super__Head_base<0UL,_bignum_ctx_*,_false>.
                                              _M_head_impl,(BN_MONT_CTX *)0x0);
                      gtest_ar_.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl =
                           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )0x0;
                      gtest_ar_.success_ = iVar3 != 0;
                      if (iVar3 == 0) {
                        testing::Message::Message((Message *)&local_78);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  (&local_70,(internal *)&gtest_ar_,
                                   (AssertionResult *)
                                   "BN_mod_exp_mont(r.get(), zero.get(), zero.get(), BN_value_one(), ctx(), nullptr)"
                                   ,"false","true",pcVar5);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_80,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                   ,0x658,local_70._M_dataplus._M_p);
                        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
                      }
                      else {
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr(&gtest_ar_.message_);
                        iVar3 = BN_is_zero((BIGNUM *)
                                           r._M_t.
                                           super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl);
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )0x0;
                        gtest_ar_.success_ = iVar3 != 0;
                        if (!gtest_ar_.success_) {
                          testing::Message::Message((Message *)&local_78);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&local_70,(internal *)&gtest_ar_,
                                     (AssertionResult *)"BN_is_zero(r.get())","false","true",pcVar5)
                          ;
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_80,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x659,local_70._M_dataplus._M_p);
                          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_80);
                          std::__cxx11::string::~string((string *)&local_70);
                          if (local_78._M_head_impl !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0) {
                            (**(code **)(*(long *)local_78._M_head_impl + 8))();
                          }
                        }
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr(&gtest_ar_.message_);
                        UVar2 = zero;
                        UVar1 = r;
                        pBVar4 = BN_value_one();
                        pcVar5 = (char *)0x0;
                        iVar3 = BN_mod_exp_mont_consttime
                                          ((BIGNUM *)
                                           UVar1._M_t.
                                           super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                           (BIGNUM *)
                                           UVar2._M_t.
                                           super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                           (BIGNUM *)
                                           UVar2._M_t.
                                           super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl,
                                           pBVar4,(BN_CTX *)
                                                  (this->super_BNTest).ctx_._M_t.
                                                  super___uniq_ptr_impl<bignum_ctx,_bssl::internal::Deleter>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_bignum_ctx_*,_bssl::internal::Deleter>
                                                  .super__Head_base<0UL,_bignum_ctx_*,_false>.
                                                  _M_head_impl,(BN_MONT_CTX *)0x0);
                        gtest_ar_.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl =
                             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )0x0;
                        gtest_ar_.success_ = iVar3 != 0;
                        if (iVar3 == 0) {
                          testing::Message::Message((Message *)&local_78);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&local_70,(internal *)&gtest_ar_,
                                     (AssertionResult *)
                                     "BN_mod_exp_mont_consttime(r.get(), zero.get(), zero.get(), BN_value_one(), ctx(), nullptr)"
                                     ,"false","true",pcVar5);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_80,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x65c,local_70._M_dataplus._M_p);
                          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78)
                          ;
                        }
                        else {
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar_.message_);
                          iVar3 = BN_is_zero((BIGNUM *)
                                             r._M_t.
                                             super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>
                                             .super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl
                                            );
                          gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl =
                               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )0x0;
                          gtest_ar_.success_ = iVar3 != 0;
                          if (gtest_ar_.success_) goto LAB_0028161c;
                          testing::Message::Message((Message *)&local_78);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    (&local_70,(internal *)&gtest_ar_,
                                     (AssertionResult *)"BN_is_zero(r.get())","false","true",pcVar5)
                          ;
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_80,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                                     ,0x65d,local_70._M_dataplus._M_p);
                          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78)
                          ;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  std::__cxx11::string::~string((string *)&local_70);
  if (local_78._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_78._M_head_impl + 8))();
  }
LAB_0028161c:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&minus_one);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&r);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&a);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&zero);
  return;
}

Assistant:

TEST_F(BNTest, ExpZeroModOne) {
  bssl::UniquePtr<BIGNUM> zero(BN_new()), a(BN_new()), r(BN_new()),
      minus_one(BN_new());
  ASSERT_TRUE(zero);
  ASSERT_TRUE(a);
  ASSERT_TRUE(r);
  ASSERT_TRUE(minus_one);
  ASSERT_TRUE(BN_set_word(minus_one.get(), 1));
  BN_set_negative(minus_one.get(), 1);
  ASSERT_TRUE(BN_rand(a.get(), 1024, BN_RAND_TOP_ONE, BN_RAND_BOTTOM_ANY));
  BN_zero(zero.get());

  ASSERT_TRUE(BN_mod_exp(r.get(), a.get(), zero.get(), BN_value_one(), ctx()));
  EXPECT_TRUE(BN_is_zero(r.get()));
  ASSERT_TRUE(
      BN_mod_exp(r.get(), zero.get(), zero.get(), BN_value_one(), ctx()));
  EXPECT_TRUE(BN_is_zero(r.get()));

  ASSERT_TRUE(BN_mod_exp_mont_word(r.get(), 42, zero.get(), BN_value_one(),
                                   ctx(), nullptr));
  EXPECT_TRUE(BN_is_zero(r.get()));
  ASSERT_TRUE(BN_mod_exp_mont_word(r.get(), 0, zero.get(), BN_value_one(),
                                   ctx(), nullptr));
  EXPECT_TRUE(BN_is_zero(r.get()));

  // |BN_mod_exp_mont| and |BN_mod_exp_mont_consttime| require fully-reduced
  // inputs, so a**0 mod 1 is not a valid call. 0**0 mod 1 is valid, however.
  ASSERT_TRUE(BN_mod_exp_mont(r.get(), zero.get(), zero.get(), BN_value_one(),
                              ctx(), nullptr));
  EXPECT_TRUE(BN_is_zero(r.get()));

  ASSERT_TRUE(BN_mod_exp_mont_consttime(r.get(), zero.get(), zero.get(),
                                        BN_value_one(), ctx(), nullptr));
  EXPECT_TRUE(BN_is_zero(r.get()));
}